

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall
Fl_Text_Buffer::search_forward
          (Fl_Text_Buffer *this,int startPos,char *searchString,int *foundPos,int matchCase)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint ucs;
  uint ucs_00;
  int iVar4;
  long lVar5;
  char *__s2;
  char *pcVar6;
  int l;
  wchar_t local_34;
  
  if (searchString != (char *)0x0) {
    if (matchCase == 0) {
      if (startPos < this->mLength) {
        do {
          cVar1 = *searchString;
          pcVar6 = searchString;
          iVar4 = startPos;
          while( true ) {
            if (cVar1 == '\0') goto LAB_001d02cf;
            ucs = char_at(this,iVar4);
            ucs_00 = fl_utf8decode(pcVar6,(char *)0x0,&local_34);
            iVar2 = fl_tolower(ucs);
            iVar3 = fl_tolower(ucs_00);
            if (iVar2 != iVar3) break;
            lVar5 = (long)local_34;
            iVar4 = next_char(this,iVar4);
            cVar1 = pcVar6[lVar5];
            pcVar6 = pcVar6 + lVar5;
          }
          startPos = next_char(this,startPos);
        } while (startPos < this->mLength);
      }
    }
    else {
      pcVar6 = searchString;
      iVar4 = startPos;
      if (startPos < this->mLength) {
        do {
          if (*pcVar6 == '\0') {
LAB_001d02cf:
            *foundPos = startPos;
            return 1;
          }
          iVar2 = fl_utf8len1(*pcVar6);
          __s2 = this->mBuf + iVar4 + ((long)this->mGapEnd - (long)this->mGapStart);
          if (iVar4 < this->mGapStart) {
            __s2 = this->mBuf + iVar4;
          }
          iVar3 = bcmp(pcVar6,__s2,(long)iVar2);
          pcVar6 = pcVar6 + iVar2;
          iVar4 = iVar2 + iVar4;
        } while ((iVar3 == 0) ||
                (startPos = next_char(this,startPos), pcVar6 = searchString, iVar4 = startPos,
                startPos < this->mLength));
      }
    }
  }
  return 0;
}

Assistant:

int Fl_Text_Buffer::search_forward(int startPos, const char *searchString,
				   int *foundPos, int matchCase) const 
{
  IS_UTF8_ALIGNED2(this, (startPos))
  IS_UTF8_ALIGNED(searchString)
  
  if (!searchString)
    return 0;
  int bp;
  const char *sp;
  if (matchCase) {
    while (startPos < length()) {
      bp = startPos;
      sp = searchString;
      for (;;) {
        char c = *sp;
        // we reached the end of the "needle", so we found the string!
        if (!c) {
          *foundPos = startPos;
          return 1;
        }
        int l = fl_utf8len1(c);
        if (memcmp(sp, address(bp), l))
          break;
        sp += l; bp += l;
      }
      startPos = next_char(startPos);
    }
  } else {
    while (startPos < length()) {
      bp = startPos;
      sp = searchString;
      for (;;) {
        // we reached the end of the "needle", so we found the string!
        if (!*sp) {
          *foundPos = startPos;
          return 1;
        }
        int l;
        unsigned int b = char_at(bp);
        unsigned int s = fl_utf8decode(sp, 0, &l);
        if (fl_tolower(b)!=fl_tolower(s))
          break;
        sp += l; 
        bp = next_char(bp);
      }
      startPos = next_char(startPos);
    }
  }  
  return 0;
}